

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool-view.h
# Opt level: O1

void __thiscall BinGE<0,_0,_1>::wakeup(BinGE<0,_0,_1> *this,int param_1,int param_2)

{
  BinGE<0,_0,_1> *local_8;
  
  if (((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v]) &&
     ((this->super_Propagator).in_queue == false)) {
    (this->super_Propagator).in_queue = true;
    local_8 = this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_Propagator).priority,(Propagator **)&local_8
              );
  }
  return;
}

Assistant:

bool isFalse() const { return sat.assigns[v] == -1 + 2 * static_cast<int>(s); }